

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O0

bool __thiscall cmProjectCommand::IncludeByVariable(cmProjectCommand *this,string *variable)

{
  cmMakefile *this_00;
  bool bVar1;
  char *__s;
  allocator<char> local_89;
  undefined1 local_88 [8];
  string m;
  allocator<char> local_51;
  string local_50;
  undefined1 local_29;
  char *pcStack_28;
  bool readit;
  char *include;
  string *variable_local;
  cmProjectCommand *this_local;
  
  include = (char *)variable;
  variable_local = (string *)this;
  __s = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,variable);
  if (__s == (char *)0x0) {
    this_local._7_1_ = 1;
  }
  else {
    this_00 = (this->super_cmCommand).Makefile;
    pcStack_28 = __s;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
    bVar1 = cmMakefile::ReadDependentFile(this_00,&local_50,true);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    if (bVar1) {
      this_local._7_1_ = 1;
    }
    else {
      local_29 = bVar1;
      bVar1 = cmSystemTools::GetFatalErrorOccured();
      if (bVar1) {
        this_local._7_1_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_88,"could not find file:\n  ",&local_89);
        std::allocator<char>::~allocator(&local_89);
        std::__cxx11::string::operator+=((string *)local_88,pcStack_28);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_88);
        this_local._7_1_ = 0;
        std::__cxx11::string::~string((string *)local_88);
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmProjectCommand::IncludeByVariable(const std::string& variable)
{
  const char* include = this->Makefile->GetDefinition(variable);
  if (!include) {
    return true;
  }

  const bool readit = this->Makefile->ReadDependentFile(include);
  if (readit) {
    return true;
  }

  if (cmSystemTools::GetFatalErrorOccured()) {
    return true;
  }

  std::string m = "could not find file:\n"
                  "  ";
  m += include;
  this->SetError(m);
  return false;
}